

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int find_address_ranges(backtrace_state *state,libbacktrace_base_address base_address,
                       dwarf_buf *unit_buf,dwarf_sections *dwarf_sections,int is_bigendian,
                       dwarf_data *altlink,backtrace_error_callback error_callback,void *data,
                       unit *u,unit_addrs_vector *addrs,dwarf_tag *unit_tag)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint64_t code;
  abbrev *paVar6;
  long lVar7;
  ulong uVar8;
  undefined4 unaff_R14D;
  undefined1 auStack_e8 [8];
  pcrange pcrange;
  undefined1 auStack_a8 [8];
  attr_val name_val;
  attr_val comp_dir_val;
  undefined1 auStack_48 [8];
  attr_val val;
  
  val.u.sint._4_4_ = is_bigendian;
  do {
    if (unit_buf->left == 0) {
      return 1;
    }
    code = read_uleb128(unit_buf);
    if (code == 0) {
LAB_0012a424:
      bVar2 = false;
      unaff_R14D = 1;
    }
    else {
      val.u.uint._0_4_ = unaff_R14D;
      paVar6 = lookup_abbrev(&u->abbrevs,code,error_callback,data);
      if (paVar6 != (abbrev *)0x0) {
        if (unit_tag != (dwarf_tag *)0x0) {
          *unit_tag = paVar6->tag;
        }
        pcrange.have_highpc = 0;
        pcrange.highpc_is_relative = 0;
        pcrange.highpc_is_addr_index = 0;
        pcrange._36_4_ = 0;
        pcrange.have_lowpc = 0;
        pcrange.lowpc_is_addr_index = 0;
        pcrange.highpc = 0;
        auStack_e8 = (undefined1  [8])0x0;
        pcrange.lowpc = 0;
        pcrange.ranges = 0;
        auStack_a8 = (undefined1  [8])0x0;
        name_val.encoding = ATTR_VAL_NONE;
        name_val._4_4_ = 0;
        name_val.u.uint = 0;
        if (paVar6->num_attrs == 0) {
          bVar2 = true;
          bVar3 = true;
        }
        else {
          lVar7 = 0;
          uVar8 = 0;
          bVar3 = false;
          bVar2 = false;
          do {
            iVar4 = read_attribute(*(dwarf_form *)((long)&paVar6->attrs->form + lVar7),
                                   *(uint64_t *)((long)&paVar6->attrs->val + lVar7),unit_buf,
                                   u->is_dwarf64,u->version,u->addrsize,dwarf_sections,altlink,
                                   (attr_val *)auStack_48);
            if (iVar4 == 0) {
              val.u.uint._0_4_ = 0;
            }
            else {
              iVar1 = *(int *)((long)&paVar6->attrs->name + lVar7);
              if (iVar1 < 0x55) {
                if (iVar1 < 0x11) {
                  if (iVar1 == 3) {
                    if ((paVar6->tag == DW_TAG_skeleton_unit) ||
                       (paVar6->tag == DW_TAG_compile_unit)) {
                      auStack_a8._4_4_ = auStack_48._4_4_;
                      auStack_a8._0_4_ = auStack_48._0_4_;
                      name_val.encoding = val.encoding;
                      name_val._4_4_ = val._4_4_;
                      bVar2 = true;
                    }
                  }
                  else if (((iVar1 == 0x10) &&
                           ((paVar6->tag == DW_TAG_skeleton_unit ||
                            (paVar6->tag == DW_TAG_compile_unit)))) &&
                          ((auStack_48._0_4_ == ATTR_VAL_REF_SECTION ||
                           (auStack_48._0_4_ == ATTR_VAL_UINT)))) {
                    u->lineoff = val._0_8_;
                  }
                }
                else if (iVar1 - 0x11U < 2) {
LAB_0012a212:
                  update_pcrange((attr *)((long)&paVar6->attrs->name + lVar7),(attr_val *)auStack_48
                                 ,(pcrange *)auStack_e8);
                }
                else if ((iVar1 == 0x1b) &&
                        ((paVar6->tag == DW_TAG_skeleton_unit ||
                         (paVar6->tag == DW_TAG_compile_unit)))) {
                  name_val.u.uint._4_4_ = auStack_48._4_4_;
                  name_val.u.uint._0_4_ = auStack_48._0_4_;
                  bVar3 = true;
                }
              }
              else if (iVar1 < 0x73) {
                if (iVar1 == 0x55) goto LAB_0012a212;
                if (((iVar1 == 0x72) &&
                    ((paVar6->tag == DW_TAG_compile_unit || (paVar6->tag == DW_TAG_skeleton_unit))))
                   && (auStack_48._0_4_ == ATTR_VAL_REF_SECTION)) {
                  u->str_offsets_base = val._0_8_;
                }
              }
              else if (iVar1 == 0x73) {
                if (((paVar6->tag == DW_TAG_compile_unit) || (paVar6->tag == DW_TAG_skeleton_unit))
                   && (auStack_48._0_4_ == ATTR_VAL_REF_SECTION)) {
                  u->addr_base = val._0_8_;
                }
              }
              else if (((iVar1 == 0x74) &&
                       ((paVar6->tag == DW_TAG_compile_unit || (paVar6->tag == DW_TAG_skeleton_unit)
                        ))) && (auStack_48._0_4_ == ATTR_VAL_REF_SECTION)) {
                u->rnglists_base = val._0_8_;
              }
            }
            unaff_R14D = val.u.uint._0_4_;
            if (iVar4 == 0) goto LAB_0012a477;
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x10;
          } while (uVar8 < paVar6->num_attrs);
          bVar2 = !bVar2;
          bVar3 = !bVar3;
        }
        unaff_R14D = val.u.uint._0_4_;
        if ((!bVar2) &&
           (iVar4 = resolve_string(dwarf_sections,u->is_dwarf64,val.u.sint._4_4_,u->str_offsets_base
                                   ,(attr_val *)auStack_a8,error_callback,data,&u->filename),
           iVar4 == 0)) {
          unaff_R14D = 0;
LAB_0012a477:
          bVar2 = false;
          goto LAB_0012a47b;
        }
        if ((bVar3) ||
           (iVar4 = resolve_string(dwarf_sections,u->is_dwarf64,val.u.sint._4_4_,u->str_offsets_base
                                   ,(attr_val *)&name_val.u,error_callback,data,&u->comp_dir),
           iVar4 != 0)) {
          uVar5 = paVar6->tag - DW_TAG_compile_unit;
          if ((uVar5 < 0x3a) && ((0x200000020000001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            iVar4 = add_ranges(state,dwarf_sections,base_address,val.u.sint._4_4_,u,
                               (uintptr_t)auStack_e8,(pcrange *)auStack_e8,add_unit_addr,u,
                               error_callback,data,addrs);
            if (iVar4 == 0) goto LAB_0012a46f;
            if (((paVar6->tag == DW_TAG_skeleton_unit) || (paVar6->tag == DW_TAG_compile_unit)) &&
               (((int)pcrange.ranges != 0 ||
                (((int)pcrange.lowpc != 0 && ((int)pcrange.highpc != 0)))))) goto LAB_0012a424;
          }
          if ((paVar6->has_children == 0) ||
             (iVar4 = find_address_ranges(state,base_address,unit_buf,dwarf_sections,
                                          val.u.sint._4_4_,altlink,error_callback,data,u,addrs,
                                          (dwarf_tag *)0x0), iVar4 != 0)) {
            bVar2 = true;
            goto LAB_0012a47b;
          }
        }
      }
LAB_0012a46f:
      unaff_R14D = 0;
      bVar2 = false;
    }
LAB_0012a47b:
    if (!bVar2) {
      return unaff_R14D;
    }
  } while( true );
}

Assistant:

static int
find_address_ranges (struct backtrace_state *state,
		     struct libbacktrace_base_address base_address,
		     struct dwarf_buf *unit_buf,
		     const struct dwarf_sections *dwarf_sections,
		     int is_bigendian, struct dwarf_data *altlink,
		     backtrace_error_callback error_callback, void *data,
		     struct unit *u, struct unit_addrs_vector *addrs,
		     enum dwarf_tag *unit_tag)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      struct pcrange pcrange;
      struct attr_val name_val;
      int have_name_val;
      struct attr_val comp_dir_val;
      int have_comp_dir_val;
      size_t i;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      if (unit_tag != NULL)
	*unit_tag = abbrev->tag;

      memset (&pcrange, 0, sizeof pcrange);
      memset (&name_val, 0, sizeof name_val);
      have_name_val = 0;
      memset (&comp_dir_val, 0, sizeof comp_dir_val);
      have_comp_dir_val = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, dwarf_sections, altlink, &val))
	    return 0;

	  switch (abbrev->attrs[i].name)
	    {
	    case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
	      update_pcrange (&abbrev->attrs[i], &val, &pcrange);
	      break;

	    case DW_AT_stmt_list:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && (val.encoding == ATTR_VAL_UINT
		      || val.encoding == ATTR_VAL_REF_SECTION))
		u->lineoff = val.u.uint;
	      break;

	    case DW_AT_name:
	      if (abbrev->tag == DW_TAG_compile_unit
		  || abbrev->tag == DW_TAG_skeleton_unit)
		{
		  name_val = val;
		  have_name_val = 1;
		}
	      break;

	    case DW_AT_comp_dir:
	      if (abbrev->tag == DW_TAG_compile_unit
		  || abbrev->tag == DW_TAG_skeleton_unit)
		{
		  comp_dir_val = val;
		  have_comp_dir_val = 1;
		}
	      break;

	    case DW_AT_str_offsets_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->str_offsets_base = val.u.uint;
	      break;

	    case DW_AT_addr_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->addr_base = val.u.uint;
	      break;

	    case DW_AT_rnglists_base:
	      if ((abbrev->tag == DW_TAG_compile_unit
		   || abbrev->tag == DW_TAG_skeleton_unit)
		  && val.encoding == ATTR_VAL_REF_SECTION)
		u->rnglists_base = val.u.uint;
	      break;

	    default:
	      break;
	    }
	}

      // Resolve strings after we're sure that we have seen
      // DW_AT_str_offsets_base.
      if (have_name_val)
	{
	  if (!resolve_string (dwarf_sections, u->is_dwarf64, is_bigendian,
			       u->str_offsets_base, &name_val,
			       error_callback, data, &u->filename))
	    return 0;
	}
      if (have_comp_dir_val)
	{
	  if (!resolve_string (dwarf_sections, u->is_dwarf64, is_bigendian,
			       u->str_offsets_base, &comp_dir_val,
			       error_callback, data, &u->comp_dir))
	    return 0;
	}

      if (abbrev->tag == DW_TAG_compile_unit
	  || abbrev->tag == DW_TAG_subprogram
	  || abbrev->tag == DW_TAG_skeleton_unit)
	{
	  if (!add_ranges (state, dwarf_sections, base_address,
			   is_bigendian, u, pcrange.lowpc, &pcrange,
			   add_unit_addr, (void *) u, error_callback, data,
			   (void *) addrs))
	    return 0;

	  /* If we found the PC range in the DW_TAG_compile_unit or
	     DW_TAG_skeleton_unit, we can stop now.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && (pcrange.have_ranges
		  || (pcrange.have_lowpc && pcrange.have_highpc)))
	    return 1;
	}

      if (abbrev->has_children)
	{
	  if (!find_address_ranges (state, base_address, unit_buf,
				    dwarf_sections, is_bigendian, altlink,
				    error_callback, data, u, addrs, NULL))
	    return 0;
	}
    }

  return 1;
}